

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O2

void __thiscall CMU462::PathTracer::~PathTracer(PathTracer *this)

{
  BVHAccel *this_00;
  
  this_00 = this->bvh;
  if (this_00 != (BVHAccel *)0x0) {
    StaticScene::BVHAccel::~BVHAccel(this_00);
  }
  operator_delete(this_00);
  if (this->gridSampler != (Sampler2D *)0x0) {
    (*this->gridSampler->_vptr_Sampler2D[1])();
  }
  if (this->hemisphereSampler != (Sampler3D *)0x0) {
    (*this->hemisphereSampler->_vptr_Sampler3D[1])();
  }
  std::_Vector_base<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>::~_Vector_base
            (&(this->rayLog).
              super__Vector_base<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>);
  std::_Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
  ::~_Deque_base((_Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
                  *)&this->selectionHistory);
  std::_Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>::~_Vector_base
            ((_Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_> *)&this->workQueue);
  std::_Vector_base<std::thread_*,_std::allocator<std::thread_*>_>::~_Vector_base
            (&(this->workerThreads).
              super__Vector_base<std::thread_*,_std::allocator<std::thread_*>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->frameBuffer).data.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>::~_Vector_base
            (&(this->sampleBuffer).data.
              super__Vector_base<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->tile_samples).super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

PathTracer::~PathTracer() {
  delete bvh;
  delete gridSampler;
  delete hemisphereSampler;
}